

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::PrintUTF8ErrorLog
               (char *field_name,char *operation_str,bool emit_stacktrace)

{
  LogMessage *pLVar1;
  LogFinisher local_89;
  string quoted_field_name;
  LogMessage local_68;
  string stacktrace;
  
  stacktrace._M_dataplus._M_p = (pointer)&stacktrace.field_2;
  stacktrace._M_string_length = 0;
  stacktrace.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&quoted_field_name,anon_var_dwarf_3678a9 + 0x11,(allocator *)&local_68);
  if (field_name != (char *)0x0) {
    StringPrintf_abi_cxx11_((string *)&local_68," \'%s\'",field_name);
    std::__cxx11::string::operator=((string *)&quoted_field_name,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  LogMessage::LogMessage
            (&local_68,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format_lite.cc"
             ,0x242);
  pLVar1 = LogMessage::operator<<(&local_68,"String field");
  pLVar1 = LogMessage::operator<<(pLVar1,&quoted_field_name);
  pLVar1 = LogMessage::operator<<(pLVar1," contains invalid ");
  pLVar1 = LogMessage::operator<<(pLVar1,"UTF-8 data when ");
  pLVar1 = LogMessage::operator<<(pLVar1,operation_str);
  pLVar1 = LogMessage::operator<<(pLVar1," a protocol ");
  pLVar1 = LogMessage::operator<<
                     (pLVar1,"buffer. Use the \'bytes\' type if you intend to send raw ");
  pLVar1 = LogMessage::operator<<(pLVar1,"bytes. ");
  pLVar1 = LogMessage::operator<<(pLVar1,&stacktrace);
  LogFinisher::operator=(&local_89,pLVar1);
  LogMessage::~LogMessage(&local_68);
  std::__cxx11::string::~string((string *)&quoted_field_name);
  std::__cxx11::string::~string((string *)&stacktrace);
  return;
}

Assistant:

void PrintUTF8ErrorLog(const char* field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  std::string quoted_field_name = "";
  if (field_name != nullptr) {
    quoted_field_name = StringPrintf(" '%s'", field_name);
  }
  GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
             << "UTF-8 data when " << operation_str << " a protocol "
             << "buffer. Use the 'bytes' type if you intend to send raw "
             << "bytes. " << stacktrace;
}